

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O1

void __thiscall L18_1::Useless::showData(Useless *this)

{
  ostream *poVar1;
  long lVar2;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Address: ",9);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ; ",3);
  if (this->n == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"(instance empty)",0x10);
  }
  else if (0 < this->n) {
    lVar2 = 0;
    do {
      local_29 = this->pc[lVar2];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->n);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void Useless::showData() const {
        cout << "Address: " << (void *) pc << " ; ";
        if (n == 0) {
            cout << "(instance empty)";
        } else {
            for(int i = 0; i < n; i++) {
                cout << pc[i];
            }
        }
        cout << endl;
    }